

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::TraverseSchema::checkAttDerivationOK
          (TraverseSchema *this,DOMElement *elem,ComplexTypeInfo *baseTypeInfo,
          ComplexTypeInfo *childTypeInfo)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  DefAttTypes DVar4;
  DefAttTypes DVar5;
  XMLAttDefList *pXVar6;
  SchemaAttDef *baseAttWildCard_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  QName *this_00;
  XMLCh *baseName;
  SchemaAttDef *this_01;
  DatatypeValidator *pDVar7;
  DatatypeValidator *pDVar8;
  XMLCh *str1;
  XMLCh *str2;
  SchemaAttDef *pSVar9;
  SchemaAttDef *childAttWildCard;
  DatatypeValidator *childDV;
  DatatypeValidator *baseDV;
  DefAttTypes childAttDefType;
  DefAttTypes baseAttDefType;
  SchemaAttDef *baseAttDef;
  XMLCh *childLocalPart;
  QName *childAttName;
  SchemaAttDef *childAttDef;
  XMLSize_t i;
  SchemaAttDef *baseAttWildCard;
  SchemaAttDefList *childAttList;
  ComplexTypeInfo *childTypeInfo_local;
  ComplexTypeInfo *baseTypeInfo_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  pXVar6 = ComplexTypeInfo::getAttDefList(childTypeInfo);
  baseAttWildCard_00 = ComplexTypeInfo::getAttWildCard(baseTypeInfo);
  childAttDef = (SchemaAttDef *)0x0;
  do {
    iVar2 = (*(pXVar6->super_XSerializable)._vptr_XSerializable[10])();
    if ((SchemaAttDef *)CONCAT44(extraout_var,iVar2) <= childAttDef) {
      pSVar9 = ComplexTypeInfo::getAttWildCard(childTypeInfo);
      if (pSVar9 != (SchemaAttDef *)0x0) {
        if (baseAttWildCard_00 == (SchemaAttDef *)0x0) {
          reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x72);
        }
        else {
          bVar1 = isWildCardSubset(this,baseAttWildCard_00,pSVar9);
          if (bVar1) {
            DVar4 = XMLAttDef::getDefaultType(&pSVar9->super_XMLAttDef);
            DVar5 = XMLAttDef::getDefaultType(&baseAttWildCard_00->super_XMLAttDef);
            if (DVar4 < DVar5) {
              reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x75);
            }
          }
          else {
            reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x73);
          }
        }
      }
      return;
    }
    iVar2 = (*(pXVar6->super_XSerializable)._vptr_XSerializable[0xb])(pXVar6,childAttDef);
    pSVar9 = (SchemaAttDef *)CONCAT44(extraout_var_00,iVar2);
    this_00 = SchemaAttDef::getAttName(pSVar9);
    baseName = QName::getLocalPart(this_00);
    uVar3 = QName::getURI(this_00);
    this_01 = ComplexTypeInfo::getAttDef(baseTypeInfo,baseName,uVar3);
    if (this_01 == (SchemaAttDef *)0x0) {
      if (baseAttWildCard_00 != (SchemaAttDef *)0x0) {
        uVar3 = QName::getURI(this_00);
        bVar1 = wildcardAllowsNamespace(this,baseAttWildCard_00,uVar3);
        if (bVar1) goto LAB_0043f26c;
      }
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x71,baseName,(XMLCh *)0x0,
                        (XMLCh *)0x0,(XMLCh *)0x0);
    }
    else {
      DVar4 = XMLAttDef::getDefaultType(&this_01->super_XMLAttDef);
      DVar5 = XMLAttDef::getDefaultType((XMLAttDef *)pSVar9);
      if ((DVar4 == DefAttTypes_Max) && (DVar5 != DefAttTypes_Max)) {
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x74,baseName,(XMLCh *)0x0,
                          (XMLCh *)0x0,(XMLCh *)0x0);
      }
      if (((DVar4 & Required) != DefAttTypes_Min) && ((DVar5 & Required) == DefAttTypes_Min)) {
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x6e,baseName,(XMLCh *)0x0,
                          (XMLCh *)0x0,(XMLCh *)0x0);
      }
      if (DVar5 != DefAttTypes_Max) {
        pDVar7 = SchemaAttDef::getDatatypeValidator(this_01);
        pDVar8 = SchemaAttDef::getDatatypeValidator(pSVar9);
        if ((pDVar7 == (DatatypeValidator *)0x0) ||
           (uVar3 = (*(pDVar7->super_XSerializable)._vptr_XSerializable[9])(pDVar7,pDVar8),
           (uVar3 & 1) == 0)) {
          reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x6f,baseName,(XMLCh *)0x0,
                            (XMLCh *)0x0,(XMLCh *)0x0);
        }
        if ((DVar4 & Fixed) != DefAttTypes_Min) {
          if ((DVar5 & Fixed) != DefAttTypes_Min) {
            str1 = XMLAttDef::getValue(&this_01->super_XMLAttDef);
            str2 = XMLAttDef::getValue((XMLAttDef *)pSVar9);
            bVar1 = XMLString::equals(str1,str2);
            if (bVar1) goto LAB_0043f26c;
          }
          reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x70,baseName,(XMLCh *)0x0,
                            (XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
    }
LAB_0043f26c:
    childAttDef = (SchemaAttDef *)
                  ((long)&(childAttDef->super_XMLAttDef).super_XSerializable._vptr_XSerializable + 1
                  );
  } while( true );
}

Assistant:

void TraverseSchema::checkAttDerivationOK(const DOMElement* const elem,
                                          const ComplexTypeInfo* const baseTypeInfo,
                                          const ComplexTypeInfo* const childTypeInfo) {

    SchemaAttDefList& childAttList = (SchemaAttDefList&) childTypeInfo->getAttDefList();
    const SchemaAttDef* baseAttWildCard = baseTypeInfo->getAttWildCard();

    for (XMLSize_t i=0; i<childAttList.getAttDefCount(); i++) {

        SchemaAttDef& childAttDef = (SchemaAttDef&) childAttList.getAttDef(i);
        QName* childAttName = childAttDef.getAttName();
        const XMLCh* childLocalPart = childAttName->getLocalPart();
        const SchemaAttDef* baseAttDef = baseTypeInfo->getAttDef(childLocalPart, childAttName->getURI());

        if (baseAttDef) {

            XMLAttDef::DefAttTypes baseAttDefType = baseAttDef->getDefaultType();
            XMLAttDef::DefAttTypes childAttDefType = childAttDef.getDefaultType();

            // Constraint 2.1.1 & 3 + check for prohibited base attribute
            if (baseAttDefType == XMLAttDef::Prohibited
                && childAttDefType != XMLAttDef::Prohibited) {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_8, childLocalPart);
            }

            if ((baseAttDefType & XMLAttDef::Required)
                && !(childAttDefType & XMLAttDef::Required)) {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_2, childLocalPart);
            }

            // if the attribute in the derived type is prohibited, and it didn't try to override a required attribute,
            // it's ok and shouldn't be tested for data type or fixed value
            if (childAttDefType == XMLAttDef::Prohibited)
                continue;

            // Constraint 2.1.2
            DatatypeValidator* baseDV = baseAttDef->getDatatypeValidator();
            DatatypeValidator* childDV = childAttDef.getDatatypeValidator();
            if (!baseDV || !baseDV->isSubstitutableBy(childDV)) {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_3, childLocalPart);
            }

            // Constraint 2.1.3
            if ((baseAttDefType & XMLAttDef::Fixed) &&
                (!(childAttDefType & XMLAttDef::Fixed) ||
                 !XMLString::equals(baseAttDef->getValue(), childAttDef.getValue()))) {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_4, childLocalPart);
            }
        }
        // Constraint 2.2
        else if (!baseAttWildCard ||
                 !wildcardAllowsNamespace(baseAttWildCard, childAttName->getURI())) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_5, childLocalPart);
        }
    }

    // Constraint 4
    const SchemaAttDef* childAttWildCard = childTypeInfo->getAttWildCard();

    if (childAttWildCard) {

        if (!baseAttWildCard) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_6);
        }
        else if (!isWildCardSubset(baseAttWildCard, childAttWildCard)) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_7);
        }
        else if (childAttWildCard->getDefaultType() < baseAttWildCard->getDefaultType()) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_9);
        }
    }
}